

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O3

void __thiscall ncnn::InnerProduct_x86::InnerProduct_x86(InnerProduct_x86 *this)

{
  InnerProduct::InnerProduct((InnerProduct *)&this->field_0x138);
  this->_vptr_InnerProduct_x86 = (_func_int **)0x360430;
  *(undefined8 *)&this->field_0x138 = 0x3604b0;
  (this->weight_data_packed).data = (void *)0x0;
  (this->weight_data_packed).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_packed).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_packed).elemsize + 4) = 0;
  (this->weight_data_packed).allocator = (Allocator *)0x0;
  (this->weight_data_packed).dims = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).h = 0;
  (this->weight_data_packed).d = 0;
  (this->weight_data_packed).c = 0;
  (this->weight_data_fp16).allocator = (Allocator *)0x0;
  (this->weight_data_fp16).dims = 0;
  (this->weight_data_fp16).w = 0;
  (this->weight_data_fp16).w = 0;
  (this->weight_data_fp16).h = 0;
  (this->weight_data_fp16).d = 0;
  (this->weight_data_fp16).c = 0;
  (this->weight_data_int8).allocator = (Allocator *)0x0;
  (this->weight_data_int8).dims = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).h = 0;
  (this->weight_data_int8).d = 0;
  (this->weight_data_int8).c = 0;
  (this->scales_in).cstep = 0;
  (this->scales_in).allocator = (Allocator *)0x0;
  (this->scales_in).dims = 0;
  (this->scales_in).w = 0;
  (this->scales_in).w = 0;
  (this->scales_in).h = 0;
  (this->scales_in).d = 0;
  (this->scales_in).c = 0;
  (this->weight_data_packed).cstep = 0;
  (this->weight_data_fp16).data = (void *)0x0;
  (this->weight_data_fp16).refcount = (int *)0x0;
  (this->weight_data_fp16).elemsize = 0;
  (this->weight_data_fp16).elempack = 0;
  (this->weight_data_int8).elempack = 0;
  (this->weight_data_int8).refcount = (int *)0x0;
  (this->weight_data_int8).elemsize = 0;
  (this->weight_data_fp16).cstep = 0;
  (this->weight_data_int8).data = (void *)0x0;
  (this->scales_in).elempack = 0;
  (this->scales_in).refcount = (int *)0x0;
  (this->scales_in).elemsize = 0;
  (this->weight_data_int8).cstep = 0;
  (this->scales_in).data = (void *)0x0;
  this->field_0x143 = 1;
  this->flatten = (Layer *)0x0;
  this->activation = (Layer *)0x0;
  return;
}

Assistant:

InnerProduct_x86::InnerProduct_x86()
{
#if __SSE2__
    support_packing = true;
#if __AVX2__
    support_weight_fp16_storage = true;
#endif
#endif // __SSE2__

    flatten = 0;
    activation = 0;
}